

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

int __thiscall PInt::GetValueInt(PInt *this,void *addr)

{
  uint uVar1;
  
  if ((*(int *)&this->field_0x28 - 1U & (uint)addr) == 0) {
    switch(*(undefined4 *)&this->field_0x24) {
    case 1:
      uVar1 = (uint)*addr;
      if (this->Unsigned != true) {
        uVar1 = (uint)(char)*addr;
      }
      break;
    case 2:
      uVar1 = (uint)*addr;
      if (this->Unsigned != true) {
        uVar1 = (uint)(short)*addr;
      }
      break;
    default:
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x40a,"virtual int PInt::GetValueInt(void *) const");
    case 4:
    case 8:
      uVar1 = *addr;
    }
    return uVar1;
  }
  __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x3f7,"virtual int PInt::GetValueInt(void *) const");
}

Assistant:

int PInt::GetValueInt(void *addr) const
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		return *(int *)addr;
	}
	else if (Size == 1)
	{
		return Unsigned ? *(BYTE *)addr : *(SBYTE *)addr;
	}
	else if (Size == 2)
	{
		return Unsigned ? *(WORD *)addr : *(SWORD *)addr;
	}
	else if (Size == 8)
	{ // truncated output
		return (int)*(QWORD *)addr;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return 0;
	}
}